

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _d,int _c,Allocator *_allocator)

{
  size_t sVar1;
  int in_ECX;
  ulong uVar2;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  Allocator *unaff_retaddr;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Mat *pMVar3;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  int local_38;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX * in_ECX * in_R8D * in_R9D) {
    pMVar3 = in_RDI;
    if ((int)in_RSI[5] < 3) {
      uVar2 = (long)in_EDX * (long)in_ECX * (long)in_R8D;
      sVar1 = ncnn::alignSize((long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2],0x10);
      if (uVar2 != sVar1 / (ulong)in_RSI[2]) {
        Mat(pMVar3);
        create(pMVar3,(int)(uVar2 >> 0x20),(int)uVar2,
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(int)in_RSI,
               (Allocator *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
          memcpy((void *)((long)pMVar3->data + (long)local_38 * pMVar3->cstep * pMVar3->elemsize),
                 (void *)(*in_RSI +
                         (long)local_38 * (long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2]),
                 (long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2]);
        }
        return in_RDI;
      }
    }
    else if ((int)in_RSI[7] != in_R9D) {
      reshape(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
              (Allocator *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,in_stack_ffffffffffffffdc,
              in_stack_ffffffffffffffd8,unaff_retaddr);
      ~Mat((Mat *)0x145f04);
      return in_RDI;
    }
    Mat(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pMVar3->dims = 4;
    pMVar3->w = in_EDX;
    pMVar3->h = in_ECX;
    pMVar3->d = in_R8D;
    pMVar3->c = in_R9D;
    sVar1 = ncnn::alignSize((long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2],0x10);
    pMVar3->cstep = sVar1 / (ulong)in_RSI[2];
  }
  else {
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}